

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

void DiffTestRecurse<Blob<128>,Blob<256>>
               (pfHash hash,Blob<128> *k1,Blob<128> *k2,Blob<256> *h1,Blob<256> *h2,int start,
               int bitsleft,vector<Blob<128>,_std::allocator<Blob<128>_>_> *diffs)

{
  uint32_t start_00;
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Blob<128> t;
  
  if (start < 0x80) {
    do {
      flipbit(k2,0x10,start);
      (*hash)(k2,0x10,0,h2);
      if (h1->bytes[0] == h2->bytes[0]) {
        uVar4 = 0xffffffffffffffff;
        do {
          if (uVar4 == 0x1e) goto LAB_00160d6c;
          lVar2 = uVar4 + 2;
          uVar1 = uVar4 + 1;
          lVar3 = uVar4 + 2;
          uVar4 = uVar1;
        } while (h1->bytes[lVar2] == h2->bytes[lVar3]);
        if (0x1e < uVar1) {
LAB_00160d6c:
          uVar5 = *(uint *)k2->bytes ^ *(uint *)k1->bytes;
          uVar6 = *(uint *)(k2->bytes + 4) ^ *(uint *)(k1->bytes + 4);
          uVar7 = *(uint *)(k2->bytes + 8) ^ *(uint *)(k1->bytes + 8);
          uVar8 = *(uint *)(k2->bytes + 0xc) ^ *(uint *)(k1->bytes + 0xc);
          t.bytes[4] = (char)uVar6;
          t.bytes[5] = (char)(uVar6 >> 8);
          t.bytes[6] = (char)(uVar6 >> 0x10);
          t.bytes[7] = (char)(uVar6 >> 0x18);
          t.bytes[0] = (char)uVar5;
          t.bytes[1] = (char)(uVar5 >> 8);
          t.bytes[2] = (char)(uVar5 >> 0x10);
          t.bytes[3] = (char)(uVar5 >> 0x18);
          t.bytes[0xc] = (char)uVar8;
          t.bytes[0xd] = (char)(uVar8 >> 8);
          t.bytes[0xe] = (char)(uVar8 >> 0x10);
          t.bytes[0xf] = (char)(uVar8 >> 0x18);
          t.bytes[8] = (char)uVar7;
          t.bytes[9] = (char)(uVar7 >> 8);
          t.bytes[10] = (char)(uVar7 >> 0x10);
          t.bytes[0xb] = (char)(uVar7 >> 0x18);
          std::vector<Blob<128>,std::allocator<Blob<128>>>::emplace_back<Blob<128>>
                    ((vector<Blob<128>,std::allocator<Blob<128>>> *)diffs,&t);
        }
      }
      start_00 = start + 1;
      if (bitsleft + -1 != 0) {
        DiffTestRecurse<Blob<128>,Blob<256>>(hash,k1,k2,h1,h2,start_00,bitsleft + -1,diffs);
      }
      flipbit(k2,0x10,start);
      start = start_00;
    } while (start_00 != 0x80);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}